

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeDeferredSeek(WhereInfo *pWInfo,Index *pIdx,int iCur,int iIdxCur)

{
  short iCol;
  i16 iVar1;
  int *zP4;
  long in_RSI;
  long *in_RDI;
  int x2;
  int x1;
  u32 *ai;
  Table *pTab;
  int i;
  Vdbe *v;
  Parse *pParse;
  u64 in_stack_ffffffffffffffa8;
  sqlite3 *db;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  Vdbe *in_stack_ffffffffffffffc8;
  Table *pTab_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  
  db = (sqlite3 *)*in_RDI;
  *(byte *)((long)in_RDI + 0x44) = *(byte *)((long)in_RDI + 0x44) & 0xfe | 1;
  sqlite3VdbeAddOp3(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                    (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                    in_stack_ffffffffffffffb8);
  if ((*(ushort *)((long)in_RDI + 0x3c) & 0x1020) != 0) {
    if (*(long *)(db->aLimit + 10) != 0) {
      db = *(sqlite3 **)(db->aLimit + 10);
    }
    if ((int)db->nTotalChange == 0) {
      pTab_00 = *(Table **)(in_RSI + 0x18);
      zP4 = (int *)sqlite3DbMallocZero(db,in_stack_ffffffffffffffa8);
      if (zP4 != (int *)0x0) {
        *zP4 = (int)pTab_00->nCol;
        for (iVar2 = 0; iVar2 < (int)(*(ushort *)(in_RSI + 0x60) - 1); iVar2 = iVar2 + 1) {
          iCol = *(short *)(*(long *)(in_RSI + 8) + (long)iVar2 * 2);
          in_stack_ffffffffffffffbc = (int)iCol;
          iVar1 = sqlite3TableColumnToStorage(pTab_00,iCol);
          if (-1 < in_stack_ffffffffffffffbc) {
            zP4[iVar1 + 1] = iVar2 + 1;
          }
        }
        sqlite3VdbeChangeP4((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                            (int)((ulong)pTab_00 >> 0x20),(char *)zP4,in_stack_ffffffffffffffbc);
      }
    }
  }
  return;
}

Assistant:

static void codeDeferredSeek(
  WhereInfo *pWInfo,              /* Where clause context */
  Index *pIdx,                    /* Index scan is using */
  int iCur,                       /* Cursor for IPK b-tree */
  int iIdxCur                     /* Index cursor */
){
  Parse *pParse = pWInfo->pParse; /* Parse context */
  Vdbe *v = pParse->pVdbe;        /* Vdbe to generate code within */

  assert( iIdxCur>0 );
  assert( pIdx->aiColumn[pIdx->nColumn-1]==-1 );

  pWInfo->bDeferredSeek = 1;
  sqlite3VdbeAddOp3(v, OP_DeferredSeek, iIdxCur, 0, iCur);
  if( (pWInfo->wctrlFlags & (WHERE_OR_SUBCLAUSE|WHERE_RIGHT_JOIN))
   && DbMaskAllZero(sqlite3ParseToplevel(pParse)->writeMask)
  ){
    int i;
    Table *pTab = pIdx->pTable;
    u32 *ai = (u32*)sqlite3DbMallocZero(pParse->db, sizeof(u32)*(pTab->nCol+1));
    if( ai ){
      ai[0] = pTab->nCol;
      for(i=0; i<pIdx->nColumn-1; i++){
        int x1, x2;
        assert( pIdx->aiColumn[i]<pTab->nCol );
        x1 = pIdx->aiColumn[i];
        x2 = sqlite3TableColumnToStorage(pTab, x1);
        testcase( x1!=x2 );
        if( x1>=0 ) ai[x2+1] = i+1;
      }
      sqlite3VdbeChangeP4(v, -1, (char*)ai, P4_INTARRAY);
    }
  }
}